

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O1

bool __thiscall i2p::sam::Session::Accept(Session *this,Connection *conn)

{
  _Head_base<0UL,_Sock_*,_false> _Var1;
  string_view source_file;
  bool bVar2;
  char cVar3;
  Logger *pLVar4;
  CThreadInterrupt *in_R8;
  int iVar5;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  string log_msg;
  string errmsg;
  Event occurred;
  CNetAddr peer_addr;
  string peer_dest;
  char *in_stack_fffffffffffffea0;
  char *local_128;
  Binary local_120;
  direct_or_indirect local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  uint16_t local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [2];
  char local_98 [32];
  direct_or_indirect local_78;
  uint local_68;
  undefined8 local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
  local_d8[0]._M_string_length = 0;
  local_d8[0].field_2._M_local_buf[0] = '\0';
  do {
    bVar2 = CThreadInterrupt::operator_cast_to_bool(this->m_interrupt);
    if (bVar2) goto LAB_0088d038;
    _Var1._M_head_impl =
         (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
         super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
         super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
    cVar3 = (**(code **)((long)(_Var1._M_head_impl)->_vptr_Sock + 0x70))
                      (_Var1._M_head_impl,1000,1,local_98);
    if (cVar3 == '\0') {
      iVar5 = 3;
      in_R8 = (CThreadInterrupt *)0x15;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (local_d8,0,local_d8[0]._M_string_length,"wait on socket failed",0x15);
    }
    else {
      iVar5 = 2;
      if (local_98[0] != '\0') {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        _Var1._M_head_impl =
             (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
             super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
             super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
        in_R8 = this->m_interrupt;
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_Sock + 0x90))
                  (&local_100,_Var1._M_head_impl,10,1000,in_R8,0x10000);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_100.indirect_contents);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.indirect_contents.indirect != &local_f0) {
          operator_delete(local_100.indirect_contents.indirect,
                          CONCAT44(local_f0._M_allocated_capacity._4_4_,
                                   local_f0._M_allocated_capacity._0_4_) + 1);
        }
        CNetAddr::CNetAddr((CNetAddr *)&local_78.indirect_contents);
        DecodeI2PBase64(&local_120,&local_58);
        DestBinToAddr((CNetAddr *)&local_100.indirect_contents,&local_120);
        if (local_120.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_120.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_120.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_120.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (0x10 < local_68) {
          free(local_78.indirect_contents.indirect);
        }
        local_78.indirect_contents.indirect = local_100.indirect_contents.indirect;
        local_78._8_8_ = local_100._8_8_;
        local_68 = local_f0._M_allocated_capacity._0_4_;
        local_60 = local_f0._8_8_;
        CService::CService((CService *)&local_100.indirect_contents,
                           (CNetAddr *)&local_78.indirect_contents,0);
        if (0x10 < (conn->peer).super_CNetAddr.m_addr._size) {
          free((conn->peer).super_CNetAddr.m_addr._union.indirect_contents.indirect);
        }
        (conn->peer).super_CNetAddr.m_addr._union.indirect_contents.indirect =
             local_100.indirect_contents.indirect;
        *(undefined8 *)((long)&(conn->peer).super_CNetAddr.m_addr._union + 8) = local_100._8_8_;
        (conn->peer).super_CNetAddr.m_addr._size = local_f0._M_allocated_capacity._0_4_;
        local_f0._M_allocated_capacity._0_4_ = 0;
        (conn->peer).super_CNetAddr.m_net = local_f0._8_4_;
        (conn->peer).super_CNetAddr.m_scope_id = local_f0._12_4_;
        (conn->peer).port = local_e0;
        iVar5 = 1;
        if (0x10 < local_68) {
          free(local_78.indirect_contents.indirect);
          local_78.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  } while (iVar5 == 2);
  if (iVar5 == 3) {
LAB_0088d038:
    bVar2 = CThreadInterrupt::operator_cast_to_bool(this->m_interrupt);
    if (bVar2) {
      pLVar4 = LogInstance();
      bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar4,I2P,Debug);
      if (bVar2) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
        source_file_00._M_len = 0x50;
        logging_function._M_str = "Accept";
        logging_function._M_len = 6;
        ::LogPrintf_<>(logging_function,source_file_00,0xd0,NET,0xfbd58b,in_stack_fffffffffffffea0);
      }
    }
    else {
      pLVar4 = LogInstance();
      bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar4,I2P,Debug);
      if (bVar2) {
        local_128 = "";
        pLVar4 = LogInstance();
        bVar2 = BCLog::Logger::Enabled(pLVar4);
        if (bVar2) {
          local_100.indirect_contents.indirect = (char *)&local_f0;
          local_100._8_8_ = 0;
          local_f0._M_allocated_capacity._0_4_ = local_f0._M_allocated_capacity._0_4_ & 0xffffff00;
          tinyformat::format<char_const*,std::__cxx11::string>
                    (&local_58,(tinyformat *)"Error accepting%s: %s\n",(char *)&local_128,
                     (char **)local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_100.indirect_contents,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          pLVar4 = LogInstance();
          local_58._M_dataplus._M_p = &DAT_00000050;
          local_58._M_string_length = 0xfbd4b8;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
          source_file._M_len = 0x50;
          str._M_str = local_100.indirect_contents.indirect;
          str._M_len = local_100._8_8_;
          logging_function_00._M_str = "Accept";
          logging_function_00._M_len = 6;
          BCLog::Logger::LogPrintStr(pLVar4,str,logging_function_00,source_file,0xd2,I2P,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100.indirect_contents.indirect != &local_f0) {
            operator_delete(local_100.indirect_contents.indirect,
                            CONCAT44(local_f0._M_allocated_capacity._4_4_,
                                     local_f0._M_allocated_capacity._0_4_) + 1);
          }
        }
      }
    }
    CheckControlSock(this);
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
    operator_delete(local_d8[0]._M_dataplus._M_p,
                    CONCAT71(local_d8[0].field_2._M_allocated_capacity._1_7_,
                             local_d8[0].field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool Session::Accept(Connection& conn)
{
    AssertLockNotHeld(m_mutex);

    std::string errmsg;
    bool disconnect{false};

    while (!*m_interrupt) {
        Sock::Event occurred;
        if (!conn.sock->Wait(MAX_WAIT_FOR_IO, Sock::RECV, &occurred)) {
            errmsg = "wait on socket failed";
            break;
        }

        if (occurred == 0) {
            // Timeout, no incoming connections or errors within MAX_WAIT_FOR_IO.
            continue;
        }

        std::string peer_dest;
        try {
            peer_dest = conn.sock->RecvUntilTerminator('\n', MAX_WAIT_FOR_IO, *m_interrupt, MAX_MSG_SIZE);
        } catch (const std::runtime_error& e) {
            errmsg = e.what();
            break;
        }

        CNetAddr peer_addr;
        try {
            peer_addr = DestB64ToAddr(peer_dest);
        } catch (const std::runtime_error& e) {
            // The I2P router is expected to send the Base64 of the connecting peer,
            // but it may happen that something like this is sent instead:
            // STREAM STATUS RESULT=I2P_ERROR MESSAGE="Session was closed"
            // In that case consider the session damaged and close it right away,
            // even if the control socket is alive.
            if (peer_dest.find("RESULT=I2P_ERROR") != std::string::npos) {
                errmsg = strprintf("unexpected reply that hints the session is unusable: %s", peer_dest);
                disconnect = true;
            } else {
                errmsg = e.what();
            }
            break;
        }

        conn.peer = CService(peer_addr, I2P_SAM31_PORT);

        return true;
    }

    if (*m_interrupt) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Accept was interrupted\n");
    } else {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Error accepting%s: %s\n", disconnect ? " (will close the session)" : "", errmsg);
    }
    if (disconnect) {
        LOCK(m_mutex);
        Disconnect();
    } else {
        CheckControlSock();
    }
    return false;
}